

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O1

void __thiscall deci_FlexLexer::yy_init_buffer(deci_FlexLexer *this,YY_BUFFER_STATE b,istream *file)

{
  int iVar1;
  int *piVar2;
  YY_BUFFER_STATE pyVar3;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  yy_flush_buffer(this,b);
  b->yy_input_file = *(streambuf **)(file + *(long *)(*(long *)file + -0x18) + 0xe8);
  b->yy_fill_buffer = 1;
  if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
    pyVar3 = (YY_BUFFER_STATE)0x0;
  }
  else {
    pyVar3 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  }
  if (pyVar3 != b) {
    b->yy_bs_lineno = 1;
    b->yy_bs_column = 0;
  }
  b->yy_is_interactive = 0;
  *piVar2 = iVar1;
  return;
}

Assistant:

void yyFlexLexer::yy_init_buffer( YY_BUFFER_STATE b, std::istream& file )

{
	int oerrno = errno;
    
	yy_flush_buffer( b );

	b->yy_input_file = file.rdbuf();
	b->yy_fill_buffer = 1;

    /* If b is the current buffer, then yy_init_buffer was _probably_
     * called from yyrestart() or through yy_get_next_buffer.
     * In that case, we don't want to reset the lineno or column.
     */
    if (b != YY_CURRENT_BUFFER){
        b->yy_bs_lineno = 1;
        b->yy_bs_column = 0;
    }

	b->yy_is_interactive = 0;
	errno = oerrno;
}